

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O0

int duckdb_lz4::LZ4_decompress_fast_usingDict
              (char *source,char *dest,int originalSize,char *dictStart,int dictSize)

{
  char *in_RCX;
  undefined4 in_EDX;
  char *in_RSI;
  int in_R8D;
  size_t in_stack_00000030;
  BYTE *in_stack_00000038;
  size_t in_stack_00000040;
  int in_stack_0000004c;
  BYTE *in_stack_00000050;
  BYTE *in_stack_00000058;
  void *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  if ((in_R8D == 0) || (in_RCX + in_R8D == in_RSI)) {
    local_4 = LZ4_decompress_unsafe_generic
                        (in_stack_00000058,in_stack_00000050,in_stack_0000004c,in_stack_00000040,
                         in_stack_00000038,in_stack_00000030);
  }
  else {
    local_4 = LZ4_decompress_fast_extDict
                        ((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,in_R8D,
                         in_stack_ffffffffffffffc8,0x233c7fa);
  }
  return local_4;
}

Assistant:

int LZ4_decompress_fast_usingDict(const char* source, char* dest, int originalSize, const char* dictStart, int dictSize)
{
    if (dictSize==0 || dictStart+dictSize == dest)
        return LZ4_decompress_unsafe_generic(
                        (const BYTE*)source, (BYTE*)dest, originalSize,
                        (size_t)dictSize, NULL, 0);
    assert(dictSize >= 0);
    return LZ4_decompress_fast_extDict(source, dest, originalSize, dictStart, (size_t)dictSize);
}